

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seq.hpp
# Opt level: O0

Maybe<rc::Shrinkable<unsigned_long>_> __thiscall
rc::Seq<rc::Shrinkable<unsigned_long>_>::next(Seq<rc::Shrinkable<unsigned_long>_> *this)

{
  bool bVar1;
  pointer pIVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  unique_ptr *in_RSI;
  Maybe<rc::Shrinkable<unsigned_long>_> MVar4;
  Seq<rc::Shrinkable<unsigned_long>_> *this_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    pIVar2 = std::
             unique_ptr<rc::Seq<rc::Shrinkable<unsigned_long>_>::ISeqImpl,_std::default_delete<rc::Seq<rc::Shrinkable<unsigned_long>_>::ISeqImpl>_>
             ::operator->((unique_ptr<rc::Seq<rc::Shrinkable<unsigned_long>_>::ISeqImpl,_std::default_delete<rc::Seq<rc::Shrinkable<unsigned_long>_>::ISeqImpl>_>
                           *)in_RSI);
    (**pIVar2->_vptr_ISeqImpl)(this);
    uVar3 = extraout_RDX;
  }
  else {
    Maybe<rc::Shrinkable<unsigned_long>_>::Maybe((Maybe<rc::Shrinkable<unsigned_long>_> *)this);
    uVar3 = extraout_RDX_00;
  }
  MVar4._8_8_ = uVar3;
  MVar4.m_storage = (Storage)this;
  return MVar4;
}

Assistant:

Maybe<T> Seq<T>::next() noexcept {
  try {
    return m_impl ? m_impl->next() : Nothing;
  } catch (...) {
    m_impl.reset();
    return Nothing;
  }
}